

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_streamable<trng::powerlaw_dist<long_double>>
               (powerlaw_dist<long_double> *d)

{
  StringRef capturedExpression;
  bool bVar1;
  AssertionHandler *this;
  powerlaw_dist<long_double> *in_RDI;
  AssertionHandler catchAssertionHandler;
  powerlaw_dist<long_double> d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffd78;
  undefined2 in_stack_fffffffffffffd7c;
  undefined1 in_stack_fffffffffffffd7e;
  undefined1 in_stack_fffffffffffffd7f;
  char *in_stack_fffffffffffffd80;
  AssertionHandler *this_00;
  StringRef *macroName;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  size_type in_stack_fffffffffffffda0;
  param_type *in_stack_fffffffffffffda8;
  AssertionHandler *in_stack_fffffffffffffdb0;
  param_type *in_stack_fffffffffffffe08;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe10;
  powerlaw_dist<long_double> local_1e8;
  stringstream local_1b0 [16];
  StringRef local_1a0 [23];
  param_type local_28;
  powerlaw_dist<long_double> *local_8;
  
  local_8 = in_RDI;
  trng::powerlaw_dist<long_double>::param_type::param_type(&local_28);
  std::__cxx11::stringstream::stringstream(local_1b0);
  macroName = local_1a0;
  this = (AssertionHandler *)trng::powerlaw_dist<long_double>::param(local_8);
  trng::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffdb0,
                   in_stack_fffffffffffffda8);
  trng::operator>>(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  trng::powerlaw_dist<long_double>::powerlaw_dist(&local_1e8,&local_28);
  operator____catch_sr
            (in_stack_fffffffffffffd80,
             CONCAT17(in_stack_fffffffffffffd7f,
                      CONCAT16(in_stack_fffffffffffffd7e,
                               CONCAT24(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78))));
  this_00 = (AssertionHandler *)&stack0xfffffffffffffdb0;
  Catch::SourceLineInfo::SourceLineInfo
            ((SourceLineInfo *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xcd);
  Catch::StringRef::StringRef((StringRef *)this,(char *)macroName);
  capturedExpression.m_start._7_1_ = in_stack_fffffffffffffd9f;
  capturedExpression.m_start._0_7_ = in_stack_fffffffffffffd98;
  capturedExpression.m_size = in_stack_fffffffffffffda0;
  Catch::AssertionHandler::AssertionHandler
            (this,macroName,(SourceLineInfo *)this_00,capturedExpression,
             CONCAT13(in_stack_fffffffffffffd7f,
                      CONCAT12(in_stack_fffffffffffffd7e,in_stack_fffffffffffffd7c)));
  bVar1 = trng::operator==((powerlaw_dist<long_double> *)this_00,
                           (powerlaw_dist<long_double> *)
                           CONCAT17(in_stack_fffffffffffffd7f,
                                    CONCAT16(in_stack_fffffffffffffd7e,
                                             CONCAT24(in_stack_fffffffffffffd7c,
                                                      in_stack_fffffffffffffd78))));
  Catch::Decomposer::operator<=
            ((Decomposer *)
             CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffffd7e,
                                     CONCAT24(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78)))
             ,false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffdb0,(ExprLhs<bool> *)in_stack_fffffffffffffda8);
  Catch::AssertionHandler::complete(this_00);
  Catch::AssertionHandler::~AssertionHandler(this_00);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}